

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall Renderer::UpdateWindowTitle(Renderer *this,int score,int fps)

{
  SDL_Window *pSVar1;
  undefined8 uVar2;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string title;
  int fps_local;
  int score_local;
  Renderer *this_local;
  
  title.field_2._8_4_ = fps;
  title.field_2._12_4_ = score;
  std::__cxx11::to_string(&local_98,score);
  std::operator+(&local_78,"Snake Score: ",&local_98);
  std::operator+(&local_58,&local_78," FPS: ");
  std::__cxx11::to_string(&local_c8,title.field_2._8_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pSVar1 = this->sdl_window;
  uVar2 = std::__cxx11::string::c_str();
  SDL_SetWindowTitle(pSVar1,uVar2);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Renderer::UpdateWindowTitle(int score, int fps) {
  std::string title{"Snake Score: " + std::to_string(score) + " FPS: " + std::to_string(fps)};
  SDL_SetWindowTitle(sdl_window, title.c_str());
}